

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O1

IntrinsicResult intrinsic_dateVal(Context *context,IntrinsicResult partialResult)

{
  TextOutputMethod *pp_Var1;
  long *plVar2;
  anon_union_8_3_2f476f46_for_data *paVar3;
  anon_union_8_3_2f476f46_for_data aVar4;
  undefined1 uVar5;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *pDVar6;
  undefined8 *puVar7;
  double dVar8;
  Value date;
  time_t t;
  undefined1 local_88 [16];
  Interpreter *local_78;
  anon_union_8_3_2f476f46_for_data local_70;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *local_68;
  anon_union_8_3_2f476f46_for_data local_60;
  _func_int **local_58;
  anon_union_8_3_2f476f46_for_data local_50;
  anon_union_8_3_2f476f46_for_data local_48;
  anon_union_8_3_2f476f46_for_data local_40;
  anon_union_8_3_2f476f46_for_data local_38;
  anon_union_8_3_2f476f46_for_data local_30;
  
  local_60.tempNum._0_1_ = false;
  pDVar6 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)operator_new(0x30);
  (pDVar6->super_RefCountedStorage).refCount = 1;
  (pDVar6->super_RefCountedStorage)._vptr_RefCountedStorage =
       (_func_int **)&PTR__StringStorage_001d10b0;
  pDVar6->mTable[0] = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x8;
  pDVar6->mTable[1] = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0xffffffffffffffff;
  puVar7 = (undefined8 *)operator_new__(8);
  pDVar6->mSize = (long)puVar7;
  *puVar7 = 0;
  *puVar7 = 0x72745365746164;
  local_68 = pDVar6;
  MiniScript::Context::GetVar
            ((Context *)local_88,(String *)partialResult.rs,(LocalOnlyMode)&local_68);
  if ((local_68 != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
     ((bool)local_60.tempNum._0_1_ == false)) {
    plVar2 = &(local_68->super_RefCountedStorage).refCount;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*(local_68->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
    local_68 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
  }
  if (local_88[0] == 1) {
    paVar3 = &local_38;
    local_40.tempNum._0_1_ = local_88[0];
    local_40.tempNum._1_2_ = local_88._1_2_;
    local_38.ref = (RefCountedStorage *)local_88._8_8_;
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    MiniScript::Value::operator=
              ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
               (Value *)&local_40);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    aVar4 = local_38;
    uVar5 = local_40.tempNum._0_1_;
  }
  else {
    if (local_88[0] == 0) {
      time((time_t *)&local_58);
    }
    else {
      MiniScript::Value::ToString((Value *)&local_78,(Machine *)local_88);
      local_58 = (_func_int **)MiniScript::ParseDate((String *)&local_78);
      if ((local_78 != (Interpreter *)0x0) && ((bool)local_70.tempNum._0_1_ == false)) {
        pp_Var1 = &local_78->standardOutput;
        *pp_Var1 = *pp_Var1 + -1;
        if (*pp_Var1 == (TextOutputMethod)0x0) {
          (*local_78->_vptr_Interpreter[1])();
        }
        local_78 = (Interpreter *)0x0;
      }
    }
    local_30.number = (double)(long)local_58;
    dVar8 = dateTimeEpoch();
    local_48.number = local_30.number - dVar8;
    paVar3 = &local_48;
    local_50.tempNum._0_2_ = 1;
    local_50.tempNum._2_1_ = 0;
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    MiniScript::Value::operator=
              ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
               (Value *)&local_50);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    aVar4 = local_48;
    uVar5 = local_50.tempNum._0_1_;
  }
  if ((2 < (byte)uVar5) && (aVar4.ref != (RefCountedStorage *)0x0)) {
    plVar2 = &(aVar4.ref)->refCount;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*(aVar4.ref)->_vptr_RefCountedStorage[1])();
    }
    paVar3->number = 0.0;
  }
  if ((2 < local_88[0]) && ((RefCountedStorage *)local_88._8_8_ != (RefCountedStorage *)0x0)) {
    plVar2 = (long *)(local_88._8_8_ + 8);
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*(*(_func_int ***)local_88._8_8_)[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_dateVal(Context *context, IntrinsicResult partialResult) {
	Value date = context->GetVar("dateStr");
	time_t t;
	if (date.IsNull()) {
		time(&t);
	} else if (date.type == ValueType::Number) {
		return IntrinsicResult(date);
	} else {
		t = ParseDate(date.ToString());
	}
	return IntrinsicResult((double)t - dateTimeEpoch());
}